

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lock.cpp
# Opt level: O3

bool __thiscall Threading::Event::_Reset(Event *this)

{
  int iVar1;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar1 == 0) {
    this[0x29] = (Event)0x0;
    pthread_cond_broadcast((pthread_cond_t *)(this + 0x30));
    pthread_mutex_unlock((pthread_mutex_t *)this);
  }
  return iVar1 == 0;
}

Assistant:

bool Threading::Event::_Reset() volatile
{
  #ifndef _POSIX
    unsigned portLONG ulVar = 0;
    // Instant wait of the state but only one value in the queue
    portBASE_TYPE  result = xQueueReceive(xQueue, &ulVar, 0);
    // Don't care of the state of the queue
    return true;
  #else
    bool isOkay = false;
    // Install clean up handlers
    pthread_cleanup_push((PThreadVoid)pthread_mutex_unlock, (void *) &event);
    int retValue = pthread_mutex_lock((HMUTEX*)&event);
    if (retValue == 0)
    {
        state = false;
        pthread_cond_broadcast((pthread_cond_t*)&condition);
        isOkay = true;
    }
    // Unlock the mutex here
    pthread_cleanup_pop(retValue == 0);
    return isOkay;
  #endif
}